

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O0

void PlayingState::CmdSetCourse
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  pointer *this;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  element_type *this_00;
  element_type *peVar4;
  ostream *poVar5;
  element_type *peVar6;
  double dVar7;
  bool local_519;
  bool local_4f1;
  bool local_4d9;
  byte local_4b9;
  vector<int,_std::allocator<int>_> local_488;
  map<int,_std::shared_ptr<Connection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
  local_470;
  string local_440 [32];
  stringstream local_420 [8];
  stringstream ss;
  ostream local_410 [376];
  shared_ptr<Connection> local_298;
  allocator local_281;
  string local_280 [39];
  byte local_259;
  string local_258 [39];
  byte local_231;
  string local_230 [39];
  byte local_209;
  string local_208 [39];
  byte local_1e1;
  string local_1e0 [39];
  byte local_1b9;
  string local_1b8 [32];
  undefined1 local_198 [8];
  Vector3 coords;
  shared_ptr<Connection> local_178;
  allocator local_161;
  string local_160 [32];
  string local_140 [32];
  undefined1 local_120 [8];
  shared_ptr<Planet> planet;
  string local_108 [32];
  shared_ptr<GameData> local_e8;
  shared_ptr<Connection> local_d8;
  undefined1 local_c8 [8];
  shared_ptr<Ship> ship;
  undefined1 local_b0 [7];
  bool course_set;
  shared_ptr<Player> player;
  double z;
  double y;
  double x;
  string local_78 [32];
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  string data;
  shared_ptr<GameData> *game_data_local;
  shared_ptr<Connection> *connection_local;
  string *input_local;
  
  this = &params.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)this,(string *)input);
  std::__cxx11::string::string(local_78,(string *)this);
  Tokenizer::GetAllTokens
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  y = 0.0;
  z = 0.0;
  player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)connection
            );
  Connection::GetPlayer((Connection *)local_b0);
  ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_b0);
  Entity::GetShip((Entity *)local_c8);
  std::shared_ptr<Connection>::shared_ptr(&local_d8,connection);
  std::shared_ptr<GameData>::shared_ptr(&local_e8,game_data);
  bVar1 = CheckCockpitCommand(&local_d8,&local_e8,true);
  std::shared_ptr<GameData>::~shared_ptr(&local_e8);
  std::shared_ptr<Connection>::~shared_ptr(&local_d8);
  if (bVar1) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
    planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
    local_4b9 = 0;
    if (sVar2 != 0) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_58,0);
      std::__cxx11::string::string(local_108,(string *)pvVar3);
      planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
      bVar1 = Utils::IsNumber((string *)local_108);
      local_4b9 = bVar1 ^ 0xff;
    }
    if ((planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1)
        != 0) {
      std::__cxx11::string::~string(local_108);
    }
    if ((local_4b9 & 1) == 0) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_58);
      local_1e1 = 0;
      local_209 = 0;
      local_231 = 0;
      local_4f1 = false;
      if (2 < sVar2) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_58,0);
        std::__cxx11::string::string(local_1e0,(string *)pvVar3);
        local_1e1 = 1;
        bVar1 = Utils::IsNumber((string *)local_1e0);
        local_4f1 = false;
        if (bVar1) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_58,1);
          std::__cxx11::string::string(local_208,(string *)pvVar3);
          local_209 = 1;
          bVar1 = Utils::IsNumber((string *)local_208);
          local_4f1 = false;
          if (bVar1) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_58,2);
            std::__cxx11::string::string(local_230,(string *)pvVar3);
            local_231 = 1;
            local_4f1 = Utils::IsNumber((string *)local_230);
          }
        }
      }
      if ((local_231 & 1) != 0) {
        std::__cxx11::string::~string(local_230);
      }
      if ((local_209 & 1) != 0) {
        std::__cxx11::string::~string(local_208);
      }
      if ((local_1e1 & 1) != 0) {
        std::__cxx11::string::~string(local_1e0);
      }
      if (local_4f1 != false) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_58,0);
        y = std::__cxx11::stod(pvVar3,(size_t *)0x0);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_58,1);
        z = std::__cxx11::stod(pvVar3,(size_t *)0x0);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_58,2);
        player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::__cxx11::stod(pvVar3,(size_t *)0x0);
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_58);
        local_259 = 0;
        local_519 = false;
        if (3 < sVar2) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_58,3);
          std::__cxx11::string::string(local_258,(string *)pvVar3);
          local_259 = 1;
          local_519 = Utils::IsNumber((string *)local_258);
        }
        if ((local_259 & 1) != 0) {
          std::__cxx11::string::~string(local_258);
        }
        if (local_519 != false) {
          peVar4 = std::__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                              )local_c8);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_58,3);
          dVar7 = std::__cxx11::stod(pvVar3,(size_t *)0x0);
          Ship::SetSpeed(peVar4,dVar7);
        }
        ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
      }
    }
    else {
      peVar6 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )game_data);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_58,0);
      std::__cxx11::string::string(local_140,(string *)pvVar3);
      GameData::GetPlanet((GameData *)local_120,(string *)peVar6);
      std::__cxx11::string::~string(local_140);
      bVar1 = std::operator==((shared_ptr<Planet> *)local_120,(nullptr_t)0x0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_160,"That planet does not exist in this system\n",&local_161);
        std::shared_ptr<Connection>::shared_ptr(&local_178,connection);
        Sender::Send((string *)local_160,&local_178);
        std::shared_ptr<Connection>::~shared_ptr(&local_178);
        std::__cxx11::string::~string(local_160);
        std::allocator<char>::~allocator((allocator<char> *)&local_161);
        coords.z._4_4_ = 1;
      }
      else {
        this_00 = std::__shared_ptr_access<Planet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Planet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_120);
        Planet::GetCoordinates((Vector3 *)local_198,this_00);
        y = (double)local_198;
        z = coords.x;
        player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)coords.y;
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_58);
        local_1b9 = 0;
        local_4d9 = false;
        if (1 < sVar2) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_58,1);
          std::__cxx11::string::string(local_1b8,(string *)pvVar3);
          local_1b9 = 1;
          local_4d9 = Utils::IsNumber((string *)local_1b8);
        }
        if ((local_1b9 & 1) != 0) {
          std::__cxx11::string::~string(local_1b8);
        }
        if (local_4d9 != false) {
          peVar4 = std::__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                              )local_c8);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_58,1);
          dVar7 = std::__cxx11::stod(pvVar3,(size_t *)0x0);
          Ship::SetSpeed(peVar4,dVar7);
        }
        ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
        coords.z._4_4_ = 0;
      }
      std::shared_ptr<Planet>::~shared_ptr((shared_ptr<Planet> *)local_120);
      if (coords.z._4_4_ != 0) goto LAB_001ece08;
    }
    if ((ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1) == 0
       ) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"Course not set, bad parameters\n",&local_281);
      std::shared_ptr<Connection>::shared_ptr(&local_298,connection);
      Sender::Send((string *)local_280,&local_298);
      std::shared_ptr<Connection>::~shared_ptr(&local_298);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      coords.z._4_4_ = 1;
      goto LAB_001ece08;
    }
    peVar4 = std::__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_c8);
    Ship::SetDestination
              (peVar4,y,z,
               (double)player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
    peVar4 = std::__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_c8);
    Ship::SetInOrbit(peVar4,false);
    peVar4 = std::__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_c8);
    dVar7 = Ship::GetSpeed(peVar4);
    ChangeSpeed(dVar7,(shared_ptr<Ship> *)local_c8);
    std::__cxx11::stringstream::stringstream(local_420);
    poVar5 = std::operator<<(local_410,"Course set for ");
    poVar5 = std::operator<<(poVar5,"X: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,y);
    poVar5 = std::operator<<(poVar5," Y: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,z);
    poVar5 = std::operator<<(poVar5," Z: ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(double)player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
    poVar5 = std::operator<<(poVar5," at speed ");
    peVar4 = std::__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_c8);
    dVar7 = Ship::GetSpeed(peVar4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
    std::operator<<(poVar5,"\n");
    std::__cxx11::stringstream::str();
    peVar6 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        game_data);
    GameData::GetLoggedInConnections(&local_470,peVar6);
    peVar4 = std::__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Ship,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_c8);
    Ship::GetPlayerIDs(&local_488,peVar4);
    Sender::SendToMultiple(local_440,&local_470,&local_488);
    std::vector<int,_std::allocator<int>_>::~vector(&local_488);
    std::
    map<int,_std::shared_ptr<Connection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
    ::~map(&local_470);
    std::__cxx11::string::~string((string *)local_440);
    std::__cxx11::stringstream::~stringstream(local_420);
  }
  coords.z._4_4_ = 0;
LAB_001ece08:
  std::shared_ptr<Ship>::~shared_ptr((shared_ptr<Ship> *)local_c8);
  std::shared_ptr<Player>::~shared_ptr((shared_ptr<Player> *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  std::__cxx11::string::~string
            ((string *)
             &params.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void PlayingState::CmdSetCourse(const std::string &input, std::shared_ptr<Connection> connection,
                                std::shared_ptr<GameData> game_data) {
    std::string data = input;
    auto params = Tokenizer::GetAllTokens(data);
    double x = 0;
    double y = 0;
    double z = 0;
    auto player = connection->GetPlayer();
    bool course_set = false;
    auto ship = player->GetShip();
    if (CheckCockpitCommand(connection, game_data, true)) {
        // TODO: Skill check

        if (params.size() > 0 and !Utils::IsNumber(params[0])) {
            auto planet = game_data->GetPlanet(params[0]);
            if (planet == nullptr) {
                Sender::Send("That planet does not exist in this system\n", connection);
                return;
            }
            else {
                Utils::Vector3 coords = planet->GetCoordinates();
                x = coords.x;
                y = coords.y;
                z = coords.z;
                if (params.size() > 1 and Utils::IsNumber(params[1])) {
                    ship->SetSpeed(std::stod(params[1]));
                }
                course_set = true;
            }
        }
        else if (params.size() >= 3 and Utils::IsNumber(params[0])
                 and Utils::IsNumber(params[1]) and Utils::IsNumber(params[2])) {
            x = std::stod(params[0]);
            y = std::stod(params[1]);
            z = std::stod(params[2]);
            if (params.size() >= 4 and Utils::IsNumber(params[3])) {
                ship->SetSpeed(std::stod(params[3]));
            }
            course_set = true;
        }
        if (!course_set) {
            Sender::Send("Course not set, bad parameters\n", connection);
            return;
        }
        ship->SetDestination(x, y, z);
        ship->SetInOrbit(false);
        ChangeSpeed(ship->GetSpeed(), ship);
        std::stringstream ss;
        ss << "Course set for " << "X: " << x << " Y: " << y
        << " Z: " << z << " at speed " << ship->GetSpeed() << "\n";
        Sender::SendToMultiple(ss.str(), game_data->GetLoggedInConnections(),
                               ship->GetPlayerIDs());
    }
}